

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcScorr.c
# Opt level: O2

Abc_Ntk_t *
Abc_NtkTestScorr(char *pFileNameIn,char *pFileNameOut,int nStepsMax,int nBTLimit,int fNewAlgo,
                int fFlopOnly,int fFfNdOnly,int fVerbose)

{
  Io_FileType_t FileType;
  int iVar1;
  FILE *pFVar2;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  char *__filename;
  Abc_Ntk_t *pNtk_01;
  Aig_Man_t *pAig;
  Gia_Man_t *pGia;
  Vec_Int_t *__ptr;
  Gia_Man_t *p;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pAVar3;
  char *__format;
  Tst_Dat_t Data;
  Cec_ParCor_t CorPars;
  
  pFVar2 = fopen(pFileNameIn,"rb");
  if (pFVar2 == (FILE *)0x0) {
    __format = "Input file \"%s\" cannot be opened.\n";
    pFileNameOut = pFileNameIn;
  }
  else {
    fclose(pFVar2);
    pFVar2 = fopen(pFileNameOut,"wb");
    if (pFVar2 == (FILE *)0x0) {
      __format = "Output file \"%s\" cannot be opened.\n";
    }
    else {
      fclose(pFVar2);
      FileType = Io_ReadFileType(pFileNameIn);
      pNtk = Io_ReadNetlist(pFileNameIn,FileType,1);
      if (pNtk == (Abc_Ntk_t *)0x0) {
        __format = "Reading input file \"%s\" has failed.\n";
        pFileNameOut = pFileNameIn;
      }
      else {
        pNtk_00 = Abc_NtkToLogic(pNtk);
        if (pNtk_00 == (Abc_Ntk_t *)0x0) {
          Abc_NtkDelete(pNtk);
          __format = "Deriving logic network from input file %s has failed.\n";
          pFileNameOut = pFileNameIn;
        }
        else {
          iVar1 = Extra_FileIsType(pFileNameIn,".bench",".BENCH",(char *)0x0);
          if (iVar1 != 0) {
            __filename = Extra_FileNameGenericAppend(pNtk_00->pSpec,".init");
            pFVar2 = fopen(__filename,"rb");
            if (pFVar2 == (FILE *)0x0) {
              __format = "Init file \"%s\" cannot be opened.\n";
              pFileNameOut = __filename;
              goto LAB_00276e07;
            }
            Io_ReadBenchInit(pNtk_00,__filename);
            Abc_NtkConvertDcLatches(pNtk_00);
            if (fVerbose != 0) {
              printf("Initial state was derived from file \"%s\".\n");
            }
          }
          pNtk_01 = Abc_NtkStrash(pNtk_00,0,1,0);
          if (pNtk_01 != (Abc_Ntk_t *)0x0) {
            pAig = Abc_NtkToDar(pNtk_01,0,1);
            Data.pNetlist = pNtk;
            if (fNewAlgo == 0) {
              Ssw_ManSetDefaultParams((Ssw_Pars_t *)&CorPars);
              Data.vId2Name = (Vec_Int_t *)0x0;
              Data.pFileNameOut = (char *)0x0;
              Data.fFlopOnly = 0;
              Data.fFfNdOnly = 0;
              Data.fDumpBmc = 0;
              Data._52_4_ = 0;
              Data.pGia = (Gia_Man_t *)0x0;
              Data.pAig = pAig;
              CorPars.fLatchCorr = nBTLimit;
              CorPars.fStopWhenGone = nStepsMax;
              __ptr = Abc_NtkMapGiaIntoNameId(pNtk,pAig,(Gia_Man_t *)0x0);
              Data.fFfNdOnly = fFfNdOnly;
              Data.fFlopOnly = fFlopOnly;
              Data.fDumpBmc = 1;
              Data.vId2Name = __ptr;
              Data.pFileNameOut = pFileNameOut;
              pMan = Ssw_SignalCorrespondence(pAig,(Ssw_Pars_t *)&CorPars);
            }
            else {
              Cec_ManCorSetDefaultParams(&CorPars);
              CorPars.fVerbose = fVerbose;
              CorPars.nBTLimit = nBTLimit;
              CorPars.nStepsMax = nStepsMax;
              CorPars.fUseCSat = 1;
              pGia = Gia_ManFromAig(pAig);
              Data.vId2Name = (Vec_Int_t *)0x0;
              Data.pFileNameOut = (char *)0x0;
              Data.fFlopOnly = 0;
              Data.fFfNdOnly = 0;
              Data.fDumpBmc = 0;
              Data._52_4_ = 0;
              Data.pAig = (Aig_Man_t *)0x0;
              Data.pGia = pGia;
              __ptr = Abc_NtkMapGiaIntoNameId(pNtk,pAig,pGia);
              Data.fFfNdOnly = fFfNdOnly;
              Data.fFlopOnly = fFlopOnly;
              Data.fDumpBmc = 1;
              CorPars.pFunc = Abc_NtkTestScorrWriteEquivGia;
              Data.vId2Name = __ptr;
              Data.pFileNameOut = pFileNameOut;
              CorPars.pData = &Data;
              p = Cec_ManLSCorrespondence(pGia,&CorPars);
              pMan = Gia_ManToAigSimple(p);
              Gia_ManStop(p);
              Gia_ManStop(pGia);
            }
            pAVar3 = Abc_NtkFromDarSeqSweep(pNtk_01,pMan);
            free(__ptr->pArray);
            free(__ptr);
            Aig_ManStop(pAig);
            Aig_ManStop(pMan);
            Abc_NtkDelete(pNtk_01);
            Abc_NtkDelete(pNtk_00);
            Abc_NtkDelete(pNtk);
            return pAVar3;
          }
          Abc_NtkDelete(pNtk_00);
          Abc_NtkDelete(pNtk);
          __format = "Deriving strashed network from input file %s has failed.\n";
          pFileNameOut = pFileNameIn;
        }
      }
    }
  }
LAB_00276e07:
  printf(__format,pFileNameOut);
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_NtkTestScorr( char * pFileNameIn, char * pFileNameOut, int nStepsMax, int nBTLimit, int fNewAlgo, int fFlopOnly, int fFfNdOnly, int fVerbose )
{
    extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
    extern Abc_Ntk_t * Abc_NtkFromDarSeqSweep( Abc_Ntk_t * pNtkOld, Aig_Man_t * pMan );

    FILE * pFile;
    Tst_Dat_t Data, * pData = &Data;
    Vec_Int_t * vId2Name;
    Abc_Ntk_t * pNetlist, * pLogic, * pStrash, * pResult;
    Aig_Man_t * pAig, * pTempAig;
    Gia_Man_t * pGia, * pTempGia;
//    int Counter = 0;
    // check the files
    pFile = fopen( pFileNameIn, "rb" );
    if ( pFile == NULL )
    {
        printf( "Input file \"%s\" cannot be opened.\n", pFileNameIn );
        return NULL;
    }
    fclose( pFile );
    // check the files
    pFile = fopen( pFileNameOut, "wb" );
    if ( pFile == NULL )
    {
        printf( "Output file \"%s\" cannot be opened.\n", pFileNameOut );
        return NULL;
    }
    fclose( pFile );
    // derive AIG for signal correspondence
    pNetlist = Io_ReadNetlist( pFileNameIn, Io_ReadFileType(pFileNameIn), 1 );
    if ( pNetlist == NULL )
    {
        printf( "Reading input file \"%s\" has failed.\n", pFileNameIn );
        return NULL;
    }
    pLogic = Abc_NtkToLogic( pNetlist );
    if ( pLogic == NULL )
    {
        Abc_NtkDelete( pNetlist );
        printf( "Deriving logic network from input file %s has failed.\n", pFileNameIn );
        return NULL;
    }
    if ( Extra_FileIsType( pFileNameIn, ".bench", ".BENCH", NULL ) )
    {
        // get the init file name
        char * pFileNameInit = Extra_FileNameGenericAppend( pLogic->pSpec, ".init" );
        pFile = fopen( pFileNameInit, "rb" );
        if ( pFile == NULL )
        {
            printf( "Init file \"%s\" cannot be opened.\n", pFileNameInit );
            return NULL;
        }
        Io_ReadBenchInit( pLogic, pFileNameInit );
        Abc_NtkConvertDcLatches( pLogic );
        if ( fVerbose )
            printf( "Initial state was derived from file \"%s\".\n", pFileNameInit );
    }
    pStrash = Abc_NtkStrash( pLogic, 0, 1, 0 );
    if ( pStrash == NULL )
    {
        Abc_NtkDelete( pLogic );
        Abc_NtkDelete( pNetlist );
        printf( "Deriving strashed network from input file %s has failed.\n", pFileNameIn );
        return NULL;
    }
    pAig = Abc_NtkToDar( pStrash, 0, 1 ); // performs "zero" internally
    // the newer computation (&scorr)
    if ( fNewAlgo )
    {
        Cec_ParCor_t CorPars, * pCorPars = &CorPars;
        Cec_ManCorSetDefaultParams( pCorPars );
        pCorPars->nBTLimit  = nBTLimit;
        pCorPars->nStepsMax = nStepsMax;
        pCorPars->fVerbose  = fVerbose;
        pCorPars->fUseCSat  = 1;
        pGia = Gia_ManFromAig( pAig );
        // prepare the data-structure
        memset( pData, 0, sizeof(Tst_Dat_t) );
        pData->pNetlist     = pNetlist;
        pData->pAig         = NULL;
        pData->pGia         = pGia;
        pData->vId2Name     = vId2Name = Abc_NtkMapGiaIntoNameId( pNetlist, pAig, pGia );
        pData->pFileNameOut = pFileNameOut;
        pData->fFlopOnly    = fFlopOnly;
        pData->fFfNdOnly    = fFfNdOnly;
        pData->fDumpBmc     = 1;
        pCorPars->pData     = pData;
        pCorPars->pFunc     = (void *)Abc_NtkTestScorrWriteEquivGia;
        // call signal correspondence
        pTempGia = Cec_ManLSCorrespondence( pGia, pCorPars );
        pTempAig = Gia_ManToAigSimple( pTempGia );
        Gia_ManStop( pTempGia );
        Gia_ManStop( pGia );
    }
    // the older computation (scorr)
    else
    {
        Ssw_Pars_t SswPars, * pSswPars = &SswPars;
        Ssw_ManSetDefaultParams( pSswPars );
        pSswPars->nBTLimit  = nBTLimit;
        pSswPars->nStepsMax = nStepsMax;
        pSswPars->fVerbose  = fVerbose;
        // preSswPare the data-structure
        memset( pData, 0, sizeof(Tst_Dat_t) );
        pData->pNetlist     = pNetlist;
        pData->pAig         = pAig;
        pData->pGia         = NULL;
        pData->vId2Name     = vId2Name = Abc_NtkMapGiaIntoNameId( pNetlist, pAig, NULL );
        pData->pFileNameOut = pFileNameOut;
        pData->fFlopOnly    = fFlopOnly;
        pData->fFfNdOnly    = fFfNdOnly;
        pData->fDumpBmc     = 1;
        pSswPars->pData     = pData;
        pSswPars->pFunc     = (void *)Abc_NtkTestScorrWriteEquivAig;
        // call signal correspondence
        pTempAig = Ssw_SignalCorrespondence( pAig, pSswPars );
    }
    // create the resulting AIG
    pResult = Abc_NtkFromDarSeqSweep( pStrash, pTempAig );
    // cleanup
    Vec_IntFree( vId2Name );
    Aig_ManStop( pAig );
    Aig_ManStop( pTempAig );
    Abc_NtkDelete( pStrash );
    Abc_NtkDelete( pLogic );
    Abc_NtkDelete( pNetlist );
    return pResult;
}